

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O0

void __thiscall
Voxelizer::count_and_create_fragment_list
          (Voxelizer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  int iVar1;
  uint32_t uVar2;
  Counter *this_00;
  element_type *this_01;
  Counter *this_02;
  element_type *peVar3;
  undefined4 extraout_var;
  VkDeviceSize range;
  VkDeviceSize offset;
  element_type *this_03;
  long in_RDI;
  VkDeviceSize size;
  shared_ptr<myvk::Fence> fence;
  uint32_t push_constants [1];
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::DescriptorSet> *in_stack_fffffffffffffdb8;
  shared_ptr<myvk::Buffer> *__r;
  shared_ptr<myvk::Buffer> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  uint32_t in_stack_fffffffffffffdcc;
  uint32_t in_stack_fffffffffffffdd0;
  VkShaderStageFlags in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  VkCommandBufferUsageFlags in_stack_fffffffffffffddc;
  CommandBuffer *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffde8;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  VkSubpassContents in_stack_fffffffffffffe04;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_stack_fffffffffffffe08;
  Ptr<Framebuffer> *in_stack_fffffffffffffe10;
  Ptr<RenderPass> *in_stack_fffffffffffffe18;
  CommandBuffer *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  uint32_t in_stack_fffffffffffffe30;
  VkFenceCreateFlags in_stack_fffffffffffffe34;
  shared_ptr<myvk::CommandBuffer> *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  VkCommandBufferLevel level;
  Scene *this_04;
  Ptr<CommandPool> *in_stack_fffffffffffffe48;
  Scene *fence_00;
  Scene *this_05;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 *puVar4;
  uint32_t value;
  shared_ptr<myvk::CommandPool> *in_stack_fffffffffffffe68;
  shared_ptr<myvk::CommandPool> *command_pool_00;
  Counter *in_stack_fffffffffffffe70;
  shared_ptr<myvk::CommandPool> *command_pool_01;
  shared_ptr<myvk::Buffer> local_118;
  undefined8 local_108;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_a9 [9];
  undefined1 local_a0 [32];
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  element_type *local_38;
  Ptr<BufferBase> *buffer;
  undefined4 extraout_var_00;
  
  level = (VkCommandBufferLevel)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  Counter::Reset(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
  myvk::CommandBuffer::Create(in_stack_fffffffffffffe48,level);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15cae2);
  myvk::CommandBuffer::Begin(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15cafe);
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = (element_type *)0x0;
  std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector
            ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)0x15cb58);
  myvk::CommandBuffer::CmdBeginRenderPass
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
  std::vector<VkClearValue,_std::allocator<VkClearValue>_>::~vector
            ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15cb9c);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffdc0,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffdb8);
  myvk::CommandBuffer::CmdBindPipeline
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x15cbe9);
  this_00 = (Counter *)
            std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x15cbf6);
  local_a9._1_8_ = local_a0;
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8)
  ;
  command_pool_01 = (shared_ptr<myvk::CommandPool> *)(local_a0 + 0x10);
  local_a9._1_8_ = command_pool_01;
  this_01 = std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x15cc4b);
  this_02 = (Counter *)Scene::GetDescriptorSet(this_01);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8)
  ;
  local_80 = (element_type *)local_a0;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  command_pool_00 = (shared_ptr<myvk::CommandPool> *)local_a9;
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x15cca3);
  __l._M_len._0_4_ = in_stack_fffffffffffffe00;
  __l._M_array = (iterator)in_stack_fffffffffffffdf8;
  __l._M_len._4_4_ = in_stack_fffffffffffffe04;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector(in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::GraphicsPipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffdc0,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffdb8);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  puVar4 = &local_d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15cd17);
  myvk::CommandBuffer::CmdBindDescriptorSets
            (in_stack_fffffffffffffde0,
             (vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x15cd58);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)local_a9);
  fence_00 = (Scene *)local_a0;
  this_04 = (Scene *)&stack0xffffffffffffff80;
  do {
    this_04 = (Scene *)&this_04[-1].m_draw_commands.
                        super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x15cda7);
    value = (uint32_t)((ulong)puVar4 >> 0x20);
    uVar2 = (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  } while (this_04 != fence_00);
  local_dc = 1;
  this_05 = this_04;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15cddc);
  myvk::CommandBuffer::CmdPushConstants
            (in_stack_fffffffffffffde0,
             (Ptr<PipelineLayout> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
             in_stack_fffffffffffffdc0);
  std::__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15ce18);
  Scene::CmdDraw(this_04,in_stack_fffffffffffffe38,
                 (shared_ptr<myvk::PipelineLayout> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),uVar2);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15ce48);
  myvk::CommandBuffer::CmdEndRenderPass((CommandBuffer *)0x15ce50);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15ce5f);
  myvk::CommandBuffer::End((CommandBuffer *)0x15ce67);
  peVar3 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15ce76);
  iVar1 = (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  buffer = (Ptr<BufferBase> *)CONCAT44(extraout_var,iVar1);
  myvk::Fence::Create((Ptr<Device> *)buffer,in_stack_fffffffffffffe34);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15ceb2);
  myvk::CommandBuffer::Submit((CommandBuffer *)this_05,(Ptr<Fence> *)fence_00);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15ced1)
  ;
  myvk::Fence::Wait((Fence *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                    CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x15ceef);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x15cefc);
  size = in_RDI + 0x58;
  uVar2 = Counter::Read(this_02,command_pool_01);
  *(uint32_t *)(in_RDI + 0xd0) = uVar2;
  uVar2 = 0;
  Counter::Reset(this_00,command_pool_00,value);
  peVar3 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15cf4f);
  iVar1 = (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  range = CONCAT44(extraout_var_00,iVar1);
  offset = (ulong)*(uint *)(in_RDI + 0xd0) << 3;
  local_118.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_118.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = 0;
  __r = &local_118;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x15cfa3);
  myvk::Buffer::Create
            ((Ptr<Device> *)__r,size,
             (VmaAllocationCreateFlags)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (VkBufferUsageFlags)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )CONCAT44(uVar2,in_stack_fffffffffffffe30));
  std::shared_ptr<myvk::Buffer>::operator=(in_stack_fffffffffffffdc0,__r);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x15d007);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15d028);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)in_stack_fffffffffffffdc0,__r);
  myvk::DescriptorSet::UpdateStorageBuffer
            ((DescriptorSet *)this_04,buffer,uVar2,in_stack_fffffffffffffe30,offset,range);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x15d073);
  this_03 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x15d095);
  myvk::BufferBase::GetSize(&this_03->super_BufferBase);
  spdlog::info<char[51],unsigned_int&,double>
            ((char (*) [51])in_stack_fffffffffffffdc0,(uint *)__r,(double *)0x15d0f2);
  return;
}

Assistant:

void Voxelizer::count_and_create_fragment_list(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	{
		m_atomic_counter.Reset(command_pool, 0);
		std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
		command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
		command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffer, {});
		{
			command_buffer->CmdBindPipeline(m_pipeline);
			command_buffer->CmdBindDescriptorSets({m_descriptor_set, m_scene_ptr->GetDescriptorSet()}, m_pipeline, {});
			uint32_t push_constants[] = {1};
			command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_FRAGMENT_BIT, 0, sizeof(uint32_t),
			                                 push_constants);
			m_scene_ptr->CmdDraw(command_buffer, m_pipeline_layout, sizeof(uint32_t));
		}
		command_buffer->CmdEndRenderPass();
		command_buffer->End();
		std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
		command_buffer->Submit(fence);
		fence->Wait();
	}

	m_voxel_fragment_count = m_atomic_counter.Read(command_pool);
	m_atomic_counter.Reset(command_pool, 0);

	m_voxel_fragment_list =
	    myvk::Buffer::Create(command_pool->GetDevicePtr(), m_voxel_fragment_count * sizeof(uint32_t) * 2, 0,
	                         VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	m_descriptor_set->UpdateStorageBuffer(m_voxel_fragment_list, 1);

	spdlog::info("Voxel fragment list created with {} voxels ({} MB)", m_voxel_fragment_count,
	             m_voxel_fragment_list->GetSize() / 1000000.0);
}